

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

ssize_t __thiscall
phosg::StringReader::pread(StringReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  uVar2 = CONCAT44(in_register_00000034,__fd);
  uVar1 = this->length;
  if (uVar1 < uVar2 || uVar1 - uVar2 == 0) {
    __nbytes = 0;
  }
  else if (uVar1 < __nbytes + uVar2) {
    memcpy(__buf,this->data + uVar2,uVar1 - uVar2);
    __nbytes = this->length - uVar2;
  }
  else {
    memcpy(__buf,this->data + uVar2,__nbytes);
  }
  return __nbytes;
}

Assistant:

size_t StringReader::pread(size_t offset, void* data, size_t size) const {
  if (offset >= this->length) {
    return 0;
  }

  size_t ret;
  if (offset + size > this->length) {
    memcpy(data, this->data + offset, this->length - offset);
    ret = this->length - offset;
  } else {
    memcpy(data, this->data + offset, size);
    ret = size;
  }
  return ret;
}